

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

WebPEncodingError
VP8LGetBackwardReferences
          (int width,int height,uint32_t *argb,int quality,int low_effort,int lz77_types_to_try,
          int cache_bits_max,int do_no_cache,VP8LHashChain *hash_chain,VP8LBackwardRefs *refs,
          int *cache_bits_best)

{
  int iVar1;
  VP8LBackwardRefs *pVVar2;
  undefined4 in_ECX;
  VP8LBackwardRefs *in_RDX;
  int in_R8D;
  undefined4 in_stack_00000008;
  VP8LBackwardRefs *refs_best;
  undefined4 in_stack_00000028;
  int in_stack_00000040;
  undefined4 in_stack_0000004c;
  int in_stack_00000050;
  int in_stack_00000054;
  undefined4 in_stack_0000006c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  VP8LHashChain *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  uint32_t *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  if (in_R8D == 0) {
    iVar1 = GetBackwardReferences
                      (in_stack_00000054,in_stack_00000050,
                       (uint32_t *)CONCAT44(in_stack_0000004c,width),height,in_stack_00000040,
                       argb._4_4_,cache_bits_max,
                       (VP8LHashChain *)CONCAT44(in_stack_0000006c,do_no_cache),
                       (VP8LBackwardRefs *)hash_chain,&refs->block_size_);
    if (iVar1 == 0) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
  }
  else {
    *(undefined4 *)CONCAT44(lz77_types_to_try,in_stack_00000028) = in_stack_00000008;
    pVVar2 = GetBackwardReferencesLowEffort
                       ((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                        (int)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        (VP8LBackwardRefs *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (pVVar2 == (VP8LBackwardRefs *)0x0) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    BackwardRefsSwap(in_RDX,(VP8LBackwardRefs *)CONCAT44(in_ECX,in_R8D));
  }
  return VP8_ENC_OK;
}

Assistant:

WebPEncodingError VP8LGetBackwardReferences(
    int width, int height, const uint32_t* const argb, int quality,
    int low_effort, int lz77_types_to_try, int cache_bits_max, int do_no_cache,
    const VP8LHashChain* const hash_chain, VP8LBackwardRefs* const refs,
    int* const cache_bits_best) {
  if (low_effort) {
    VP8LBackwardRefs* refs_best;
    *cache_bits_best = cache_bits_max;
    refs_best = GetBackwardReferencesLowEffort(
        width, height, argb, cache_bits_best, hash_chain, refs);
    if (refs_best == NULL) return VP8_ENC_ERROR_OUT_OF_MEMORY;
    // Set it in first position.
    BackwardRefsSwap(refs_best, &refs[0]);
  } else {
    if (!GetBackwardReferences(width, height, argb, quality, lz77_types_to_try,
                               cache_bits_max, do_no_cache, hash_chain, refs,
                               cache_bits_best)) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
  }
  return VP8_ENC_OK;
}